

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CECoordinates.cpp
# Opt level: O2

bool __thiscall test_CECoordinates::test_HmsDms2Angle(test_CECoordinates *this)

{
  double dVar1;
  undefined1 uVar2;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  allocator local_e9;
  CEAngle local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_bc;
  double test4b;
  double test4a;
  double test2b;
  double test2a;
  double ang_var;
  vector<double,_std::allocator<double>_> hrs_vec;
  double ang_rad;
  vector<double,_std::allocator<double>_> test3;
  vector<double,_std::allocator<double>_> test1;
  double tol_old;
  vector<double,_std::allocator<double>_> ang_vec;
  
  ang_var = 45.50833333333333;
  CEAngle::Deg(&local_e8,&ang_var);
  dVar1 = CEAngle::Rad(&local_e8);
  CEAngle::~CEAngle(&local_e8);
  local_d8 = 0x403e000000000000;
  uStack_d0 = 0;
  local_e8._vptr_CEAngle = (_func_int **)0x4046800000000000;
  local_e8.angle_ = 30.0;
  ang_rad = dVar1;
  std::allocator<double>::allocator((allocator<double> *)&hrs_vec);
  __l._M_len = 4;
  __l._M_array = (iterator)&local_e8;
  std::vector<double,_std::allocator<double>_>::vector(&ang_vec,__l,(allocator<double> *)&hrs_vec);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&hrs_vec);
  local_d8 = 0x4000000000000000;
  uStack_d0 = 0;
  local_e8._vptr_CEAngle = (_func_int **)0x4008000000000000;
  local_e8.angle_ = 2.0;
  std::allocator<double>::allocator((allocator<double> *)&test1);
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_e8;
  std::vector<double,_std::allocator<double>_>::vector(&hrs_vec,__l_00,(allocator<double> *)&test1);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&test1);
  tol_old = (double)(**(code **)(*(long *)this + 0x20))(this);
  local_e8._vptr_CEAngle = (_func_int **)0x3da5fd7fe1796495;
  (**(code **)(*(long *)this + 0x30))(this);
  local_e8._vptr_CEAngle = (_func_int **)((ulong)local_e8._vptr_CEAngle & 0xffffffff00000000);
  CECoordinates::GetDMS(&test1,&ang_var,(CEAngleType *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"test_HmsDms2Angle",(allocator *)&test2a);
  test3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  ._0_4_ = 0x204;
  CETestSuite::test_vect((vector *)this,(vector *)&test1,(string *)&ang_vec,(int *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test2a);
  local_e8._vptr_CEAngle = (_func_int **)((ulong)local_e8._vptr_CEAngle & 0xffffffff00000000);
  test2a = CECoordinates::DMSToAngle(&ang_vec,(CEAngleType *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"test_HmsDms2Angle",(allocator *)&test2b);
  test3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  ._0_4_ = 0x208;
  (**(code **)(*(long *)this + 0x58))(this,&test2a,&ang_var,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test2b);
  local_e8._vptr_CEAngle._0_4_ = 1;
  test2b = CECoordinates::DMSToAngle(&ang_vec,(CEAngleType *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"test_HmsDms2Angle",(allocator *)&test4a);
  test3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  ._0_4_ = 0x20a;
  (**(code **)(*(long *)this + 0x58))(this,&test2b,&ang_rad,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test4a);
  local_e8._vptr_CEAngle._0_4_ = 0;
  CECoordinates::GetHMS(&test3,&ang_var,(CEAngleType *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"test_HmsDms2Angle",(allocator *)&test4b);
  test4a = (double)CONCAT44(test4a._4_4_,0x20e);
  CETestSuite::test_vect((vector *)this,(vector *)&test3,(string *)&hrs_vec,(int *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test4b);
  local_e8._vptr_CEAngle._0_4_ = 0;
  test4a = CECoordinates::HMSToAngle(&hrs_vec,(CEAngleType *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"test_HmsDms2Angle",(allocator *)&local_bc);
  test4b = (double)CONCAT44(test4b._4_4_,0x212);
  (**(code **)(*(long *)this + 0x58))(this,&test4a,&ang_var,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_bc);
  local_e8._vptr_CEAngle = (_func_int **)CONCAT44(local_e8._vptr_CEAngle._4_4_,1);
  test4b = CECoordinates::HMSToAngle(&hrs_vec,(CEAngleType *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"test_HmsDms2Angle",&local_e9);
  local_bc = 0x214;
  (**(code **)(*(long *)this + 0x58))(this,&test4b,&ang_rad,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_e9);
  (**(code **)(*(long *)this + 0x30))(this,&tol_old);
  uVar2 = (**(code **)(*(long *)this + 0x18))(this);
  std::vector<double,_std::allocator<double>_>::~vector(&test3);
  std::vector<double,_std::allocator<double>_>::~vector(&test1);
  std::vector<double,_std::allocator<double>_>::~vector(&hrs_vec);
  std::vector<double,_std::allocator<double>_>::~vector(&ang_vec);
  return (bool)uVar2;
}

Assistant:

bool test_CECoordinates::test_HmsDms2Angle(void)
{
    // Create some variables for testing
    double              ang_var(45.50833333333333);
    double              ang_rad = CEAngle::Deg(ang_var).Rad();
    std::vector<double> ang_vec = {45, 30, 30, 0.0};
    std::vector<double> hrs_vec = {3.0, 2.0, 2.0, 0.0};

    // Increase the acceptable tolerance
    double tol_old(DblTol());
    SetDblTol(1.0e-11);

    // Test angle -> DMS 
    std::vector<double> test1 = CECoordinates::GetDMS(ang_var, CEAngleType::DEGREES);
    test_vect(test1, ang_vec, __func__, __LINE__);

    // Test DMS -> angle
    double test2a(CECoordinates::DMSToAngle(ang_vec, CEAngleType::DEGREES));
    test_double(test2a, ang_var, __func__, __LINE__);
    double test2b(CECoordinates::DMSToAngle(ang_vec, CEAngleType::RADIANS));
    test_double(test2b, ang_rad, __func__, __LINE__);
    
    // Test angle -> HMS 
    std::vector<double> test3 = CECoordinates::GetHMS(ang_var, CEAngleType::DEGREES);
    test_vect(test3, hrs_vec, __func__, __LINE__);

    // Test HMS -> angle
    double test4a(CECoordinates::HMSToAngle(hrs_vec, CEAngleType::DEGREES));
    test_double(test4a, ang_var, __func__, __LINE__);
    double test4b(CECoordinates::HMSToAngle(hrs_vec, CEAngleType::RADIANS));
    test_double(test4b, ang_rad, __func__, __LINE__);

    // Reset the tolerance
    SetDblTol(tol_old);

    return pass();
}